

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb_cpu_io.h
# Opt level: O2

void __thiscall Gbs_Emu::cpu_write(Gbs_Emu *this,gb_addr_t addr,int data)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = addr - 0xa000;
  if (uVar4 < 0x6000) {
    this->ram[uVar4] = (byte)data;
    if ((addr ^ 0xe000) < 0x1f80) {
      if (addr - 0xff10 < 0x30) {
        Gb_Apu::write_register
                  (&this->apu,this->cpu_time + ((this->super_Gb_Cpu).state)->remain * -4,addr,data);
        return;
      }
      if ((addr ^ 0xff06) < 2) {
        bVar2 = (this->header_).timer_mode;
        iVar3 = 0x11250;
        if ((bVar2 & 4) != 0) {
          iVar3 = 0x100 - (uint)this->ram[0x5f06] <<
                  ("\n\x04\x06\b"[this->ram[0x5f07] & 3] + ((char)bVar2 >> 7) & 0x3f);
        }
        this->play_period = iVar3;
        dVar1 = (this->super_Classic_Emu).super_Music_Emu.tempo_;
        if (dVar1 != 1.0) {
          this->play_period = (int)((double)iVar3 / dVar1);
        }
        return;
      }
      if (addr == 0xff00) {
        this->ram[uVar4] = '\0';
        return;
      }
      this->ram[uVar4] = 0xff;
    }
  }
  else if ((addr ^ 0x2000) < 0x2000) {
    set_bank(this,data);
    return;
  }
  return;
}

Assistant:

void Gbs_Emu::cpu_write( gb_addr_t addr, int data )
{
	unsigned offset = addr - ram_addr;
	if ( offset <= 0xFFFF - ram_addr )
	{
		ram [offset] = data;
		if ( (addr ^ 0xE000) <= 0x1F80 - 1 )
		{
			if ( unsigned (addr - Gb_Apu::start_addr) < Gb_Apu::register_count )
			{
				GME_APU_HOOK( this, addr - Gb_Apu::start_addr, data );
				apu.write_register( clock(), addr, data );
			}
			else if ( (addr ^ 0xFF06) < 2 )
				update_timer();
			else if ( addr == joypad_addr )
				ram [offset] = 0; // keep joypad return value 0
			else
				ram [offset] = 0xFF;

			//if ( addr == 0xFFFF )
			//  debug_printf( "Wrote interrupt mask\n" );
		}
	}